

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

void loguru::write_hex_digit(string *out,uint num)

{
  void *pvVar1;
  Text str_left;
  Text fail_info;
  Text str_right;
  
  if ((uint)out < 0x10) {
    std::__cxx11::string::push_back('\b');
    return;
  }
  textprintf((char *)&str_left,"%u");
  textprintf((char *)&str_right,"%u",0x10);
  textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","num","<","16u",
             str_left._str,"<",str_right._str);
  pvVar1 = calloc(1,1);
  log_and_abort(0,fail_info._str,
                "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                ,0x1f5,"%s",pvVar1);
}

Assistant:

static void write_hex_digit(std::string& out, unsigned num)
	{
		DCHECK_LT_F(num, 16u);
		if (num < 10u) { out.push_back(char('0' + num)); }
		else { out.push_back(char('A' + num - 10)); }
	}